

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

size_t check_for_missing<PredictionData<double,int>>
                 (PredictionData<double,_int> *prediction_data,Imputer *imputer,size_t *ix_arr,
                 int nthreads)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  size_t sVar10;
  int *piVar11;
  size_t sVar12;
  vector<char,_std::allocator<char>_> has_missing;
  allocator_type local_3a;
  value_type_conflict5 local_39;
  vector<char,_std::allocator<char>_> local_38;
  
  local_39 = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            (&local_38,prediction_data->nrows,&local_39,&local_3a);
  uVar5 = prediction_data->nrows;
  if (uVar5 == 0) {
LAB_001d45ef:
    if (prediction_data->nrows == 0) {
      sVar10 = 0;
    }
    else {
      uVar5 = 0;
      sVar10 = 0;
      do {
        if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar5] != '\0') {
          sVar12 = ix_arr[sVar10];
          ix_arr[sVar10] = ix_arr[uVar5];
          ix_arr[uVar5] = sVar12;
          sVar10 = sVar10 + 1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < prediction_data->nrows);
    }
    if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return sVar10;
  }
  lVar4 = 0;
  lVar6 = 0;
  uVar7 = 0;
LAB_001d44d4:
  pdVar3 = prediction_data->numeric_data;
  if (pdVar3 == (double *)0x0) {
    if (prediction_data->Xr != (double *)0x0) {
      iVar1 = prediction_data->Xr_indptr[uVar7];
      lVar9 = (long)iVar1;
      iVar2 = prediction_data->Xr_indptr[uVar7 + 1];
      if (iVar1 < iVar2) {
        do {
          if (0x7fefffffffffffff < (ulong)ABS(prediction_data->Xr[lVar9])) goto LAB_001d4560;
          lVar9 = lVar9 + 1;
        } while (iVar2 != lVar9);
      }
    }
  }
  else {
    sVar10 = imputer->ncols_numeric;
    if (prediction_data->is_col_major == false) {
      if (sVar10 != 0) {
        sVar12 = 0;
        do {
          if (0x7fefffffffffffff <
              (*(ulong *)((long)pdVar3 + sVar12 * 8 + sVar10 * lVar6) & 0x7fffffffffffffff))
          goto LAB_001d4560;
          sVar12 = sVar12 + 1;
        } while (sVar10 != sVar12);
      }
    }
    else if (sVar10 != 0) {
      puVar8 = (ulong *)((long)pdVar3 + lVar6);
      do {
        if (0x7fefffffffffffff < (*puVar8 & 0x7fffffffffffffff)) goto LAB_001d4560;
        puVar8 = puVar8 + uVar5;
        sVar10 = sVar10 - 1;
      } while (sVar10 != 0);
    }
  }
  goto LAB_001d456a;
LAB_001d4560:
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [uVar7] = '\x01';
LAB_001d456a:
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] == '\0') {
    if (prediction_data->is_col_major == false) {
      sVar10 = imputer->ncols_categ;
      if (sVar10 != 0) {
        sVar12 = 0;
        do {
          if (*(int *)((long)prediction_data->categ_data + sVar12 * 4 + sVar10 * lVar4) < 0)
          goto LAB_001d45e8;
          sVar12 = sVar12 + 1;
        } while (sVar10 != sVar12);
      }
    }
    else {
      sVar10 = imputer->ncols_categ;
      if (sVar10 != 0) {
        piVar11 = (int *)((long)prediction_data->categ_data + lVar4);
        do {
          if (*piVar11 < 0) goto LAB_001d45e8;
          piVar11 = piVar11 + prediction_data->nrows;
          sVar10 = sVar10 - 1;
        } while (sVar10 != 0);
      }
    }
  }
LAB_001d4576:
  uVar7 = uVar7 + 1;
  uVar5 = prediction_data->nrows;
  lVar6 = lVar6 + 8;
  lVar4 = lVar4 + 4;
  if (uVar5 <= uVar7) goto LAB_001d45ef;
  goto LAB_001d44d4;
LAB_001d45e8:
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [uVar7] = '\x01';
  goto LAB_001d4576;
}

Assistant:

size_t check_for_missing(PredictionData  &prediction_data,
                         Imputer         &imputer,
                         size_t          ix_arr[],
                         int             nthreads)
{
    std::vector<char> has_missing(prediction_data.nrows, false);

    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(has_missing, prediction_data, imputer)
    for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
    {
        if (prediction_data.numeric_data != NULL)
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }

        else if (prediction_data.Xr != NULL)
        {
            for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            {
                if (is_na_or_inf(prediction_data.Xr[ix]))
                {
                    has_missing[row] = true;
                    break;
                }
            }
        }

        if (!has_missing[row])
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }
    }

    size_t st = 0;
    size_t temp;
    for (size_t row = 0; row < prediction_data.nrows; row++)
    {
        if (has_missing[row])
        {
            temp        = ix_arr[st];
            ix_arr[st]  = ix_arr[row];
            ix_arr[row] = temp;
            st++;
        }
    }

    if (st == 0)
        return 0;

    return st;
}